

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_rotate(lua_State *L,int idx,int n)

{
  StkId pTVar1;
  Value VVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 uVar6;
  TValue *io1_5;
  TValue *pTVar7;
  TValue *io1_3;
  TValue *pTVar8;
  TValue *pTVar9;
  TValue *pTVar10;
  TValue *io1;
  TValue *pTVar11;
  TValue *pTVar12;
  bool bVar13;
  
  pTVar1 = L->top;
  pTVar12 = pTVar1 + -1;
  pTVar7 = index2addr(L,idx);
  if (n < 0) {
    pTVar8 = pTVar7 + (-1 - (long)n);
  }
  else {
    pTVar8 = pTVar12 + -(ulong)(uint)n;
  }
  pTVar11 = pTVar7;
  pTVar10 = pTVar8;
  if (pTVar7 < pTVar8) {
    do {
      pTVar9 = pTVar10 + -1;
      VVar2 = pTVar11->value_;
      iVar5 = pTVar11->tt_;
      uVar6 = *(undefined4 *)&pTVar11->field_0xc;
      iVar3 = pTVar10->tt_;
      uVar4 = *(undefined4 *)&pTVar10->field_0xc;
      pTVar11->value_ = pTVar10->value_;
      pTVar11->tt_ = iVar3;
      *(undefined4 *)&pTVar11->field_0xc = uVar4;
      pTVar10->value_ = VVar2;
      pTVar10->tt_ = iVar5;
      *(undefined4 *)&pTVar10->field_0xc = uVar6;
      pTVar11 = pTVar11 + 1;
      pTVar10 = pTVar9;
    } while (pTVar11 < pTVar9);
  }
  pTVar8 = pTVar8 + 1;
  if (pTVar8 < pTVar12) {
    pTVar10 = pTVar1 + -2;
    do {
      VVar2 = pTVar8->value_;
      iVar5 = pTVar8->tt_;
      uVar6 = *(undefined4 *)&pTVar8->field_0xc;
      iVar3 = pTVar10[1].tt_;
      uVar4 = *(undefined4 *)&pTVar10[1].field_0xc;
      pTVar8->value_ = pTVar10[1].value_;
      pTVar8->tt_ = iVar3;
      *(undefined4 *)&pTVar8->field_0xc = uVar4;
      pTVar10[1].value_ = VVar2;
      pTVar10[1].tt_ = iVar5;
      *(undefined4 *)&pTVar10[1].field_0xc = uVar6;
      pTVar8 = pTVar8 + 1;
      bVar13 = pTVar8 < pTVar10;
      pTVar10 = pTVar10 + -1;
    } while (bVar13);
  }
  if (pTVar7 < pTVar12) {
    pTVar12 = pTVar1 + -2;
    do {
      VVar2 = pTVar7->value_;
      iVar5 = pTVar7->tt_;
      uVar6 = *(undefined4 *)&pTVar7->field_0xc;
      iVar3 = pTVar12[1].tt_;
      uVar4 = *(undefined4 *)&pTVar12[1].field_0xc;
      pTVar7->value_ = pTVar12[1].value_;
      pTVar7->tt_ = iVar3;
      *(undefined4 *)&pTVar7->field_0xc = uVar4;
      pTVar12[1].value_ = VVar2;
      pTVar12[1].tt_ = iVar5;
      *(undefined4 *)&pTVar12[1].field_0xc = uVar6;
      pTVar7 = pTVar7 + 1;
      bVar13 = pTVar7 < pTVar12;
      pTVar12 = pTVar12 + -1;
    } while (bVar13);
  }
  return;
}

Assistant:

LUA_API void lua_rotate (lua_State *L, int idx, int n) {
  StkId p, t, m;
  lua_lock(L);
  t = L->top - 1;  /* end of stack segment being rotated */
  p = index2addr(L, idx);  /* start of segment */
  api_checkstackindex(L, idx, p);
  api_check(L, (n >= 0 ? n : -n) <= (t - p + 1), "invalid 'n'");
  m = (n >= 0 ? t - n : p - n - 1);  /* end of prefix */
  reverse(L, p, m);  /* reverse the prefix with length 'n' */
  reverse(L, m + 1, t);  /* reverse the suffix */
  reverse(L, p, t);  /* reverse the entire segment */
  lua_unlock(L);
}